

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68020_bsr_32(m68k_info *info)

{
  byte bVar1;
  uint uVar2;
  
  if ((info->type & 0x1c) != 0) {
    uVar2 = peek_imm_32(info);
    MCInst_setOpcode(info->inst,0x1c);
    (info->extension).op_count = '\x01';
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x4;
    (info->extension).operands[0].type = M68K_OP_BR_DISP;
    (info->extension).operands[0].address_mode = M68K_AM_BRANCH_DISPLACEMENT;
    (info->extension).operands[0].br_disp.disp = uVar2;
    (info->extension).operands[0].br_disp.disp_size = '\x04';
    bVar1 = info->groups_count;
    info->groups_count = bVar1 + 1;
    info->groups[bVar1] = '\x01';
    bVar1 = info->groups_count;
    info->groups_count = bVar1 + 1;
    info->groups[bVar1] = '\a';
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68020_bsr_32(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68020_PLUS);
	build_relative_branch(info, M68K_INS_BSR, 4, peek_imm_32(info));
}